

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_GetThreshold(GetThresholdForm1 GetThreshold)

{
  value_type vVar1;
  uchar uVar2;
  uchar uVar3;
  reference pvVar4;
  byte *pbVar5;
  reference pvVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uchar *puVar7;
  code *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff4c;
  allocator_type *in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff4c);
  while( true ) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
    if (vVar1 != *pvVar4) break;
    Unit_Test::intensityArray(in_stack_ffffffffffffff4c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (in_stack_ffffffffffffff60,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff60);
  }
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1d698b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (value_type_conflict3 *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1d69b0);
  pvVar8 = &local_20;
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar8,0);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (local_60,(ulong)*pbVar5);
  *pvVar6 = *pvVar6 + 1;
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar8,1);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (local_60,(ulong)*pbVar5);
  *pvVar6 = *pvVar6 + 1;
  uVar3 = (*local_8)(local_60);
  pvVar8 = &local_20;
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar8,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar8,1);
  puVar7 = std::min<unsigned_char>((uchar *)this,pvVar4);
  uVar2 = *puVar7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return uVar3 == uVar2;
}

Assistant:

bool form1_GetThreshold(GetThresholdForm1 GetThreshold)
    {
        std::vector < uint8_t > intensity = intensityArray( 2 );
        while (intensity[0] == intensity[1])
            intensity = intensityArray( 2 );

        std::vector< uint32_t > histogram( 256u, 0);
        ++histogram[intensity[0]];
        ++histogram[intensity[1]];

        return GetThreshold(histogram) == std::min(intensity[0], intensity[1]);
    }